

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<_duckdb_logical_type_*const_&,__duckdb_logical_type_*const_&> * __thiscall
Catch::ExprLhs<_duckdb_logical_type*const&>::operator!=
          (BinaryExpr<_duckdb_logical_type_*const_&,__duckdb_logical_type_*const_&>
           *__return_storage_ptr__,ExprLhs<_duckdb_logical_type*const&> *this,
          _duckdb_logical_type **rhs)

{
  _duckdb_logical_type **pp_Var1;
  _duckdb_logical_type *p_Var2;
  _duckdb_logical_type *p_Var3;
  StringRef local_40;
  
  pp_Var1 = *(_duckdb_logical_type ***)this;
  p_Var2 = *pp_Var1;
  p_Var3 = *rhs;
  StringRef::StringRef(&local_40,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = p_Var2 != p_Var3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_005712f0;
  __return_storage_ptr__->m_lhs = pp_Var1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }